

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::OstreamView
          (OstreamView *this,LogMessageData *message_data)

{
  uint64_t max_size;
  size_type sVar1;
  pointer pcVar2;
  Span<char> SVar3;
  
  *(code **)this = sysconf;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__OstreamView_00457c10;
  this->data_ = message_data;
  pcVar2 = (message_data->encoded_remaining_actual_do_not_use_directly).ptr_;
  if (pcVar2 == (pointer)0x0) {
    (message_data->encoded_remaining_actual_do_not_use_directly).ptr_ =
         (message_data->encoded_buf)._M_elems;
    (message_data->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(message_data);
    pcVar2 = (message_data->encoded_remaining_actual_do_not_use_directly).ptr_;
  }
  max_size = (message_data->encoded_remaining_actual_do_not_use_directly).len_;
  (this->encoded_remaining_copy_).ptr_ = pcVar2;
  (this->encoded_remaining_copy_).len_ = max_size;
  (this->message_start_).ptr_ = (pointer)0x0;
  (this->message_start_).len_ = 0;
  (this->string_start_).ptr_ = (pointer)0x0;
  (this->string_start_).len_ = 0;
  SVar3 = EncodeMessageStart(7,max_size,&this->encoded_remaining_copy_);
  this->message_start_ = SVar3;
  SVar3 = EncodeMessageStart(1,(this->encoded_remaining_copy_).len_,&this->encoded_remaining_copy_);
  this->string_start_ = SVar3;
  pcVar2 = (this->encoded_remaining_copy_).ptr_;
  sVar1 = (this->encoded_remaining_copy_).len_;
  *(pointer *)&this->field_0x28 = pcVar2;
  *(pointer *)&this->field_0x20 = pcVar2;
  *(pointer *)&this->field_0x30 = pcVar2 + sVar1;
  std::ios::rdbuf((streambuf *)
                  (&this->data_->manipulated + *(long *)(*(long *)&this->data_->manipulated + -0x18)
                  ));
  return;
}

Assistant:

LogMessage::OstreamView::OstreamView(LogMessageData& message_data)
    : data_(message_data), encoded_remaining_copy_(data_.encoded_remaining()) {
  // This constructor sets the `streambuf` up so that streaming into an attached
  // ostream encodes string data in-place.  To do that, we write appropriate
  // headers into the buffer using a copy of the buffer view so that we can
  // decide not to keep them later if nothing is ever streamed in.  We don't
  // know how much data we'll get, but we can use the size of the remaining
  // buffer as an upper bound and fill in the right size once we know it.
  message_start_ =
      EncodeMessageStart(EventTag::kValue, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  string_start_ =
      EncodeMessageStart(ValueTag::kString, encoded_remaining_copy_.size(),
                         &encoded_remaining_copy_);
  setp(encoded_remaining_copy_.data(),
       encoded_remaining_copy_.data() + encoded_remaining_copy_.size());
  data_.manipulated.rdbuf(this);
}